

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QString * QtTimeZoneLocale::zoneOffsetFormat
                    (QString *__return_storage_ptr__,QLocale *locale,qsizetype param_2,
                    FormatType width,QDateTime *when,int offsetSeconds)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  QDateTime local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QLocale::system((char *)&local_58);
  bVar4 = ::operator!=(locale,(QLocale *)&local_58);
  if (bVar4) {
    QDateTime::timeRepresentation(&local_38);
    QTimeZone::displayName(__return_storage_ptr__,(QTimeZone *)&local_38,when,OffsetName,locale);
    QTimeZone::~QTimeZone((QTimeZone *)&local_38);
  }
  else {
    QDateTime::toOffsetFromUtc(&local_38,(int)when);
    QDateTime::timeZoneAbbreviation(__return_storage_ptr__,&local_38);
    QDateTime::~QDateTime(&local_38);
  }
  QLocale::~QLocale((QLocale *)&local_58);
  if ((__return_storage_ptr__->d).size != 0) {
    offsetFromAbbreviation((QString *)&local_58,__return_storage_ptr__);
    pDVar2 = (__return_storage_ptr__->d).d;
    pcVar3 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_58.d;
    (__return_storage_ptr__->d).ptr = local_58.ptr;
    qVar1 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_58.size;
    local_58.d = pDVar2;
    local_58.ptr = pcVar3;
    local_58.size = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString zoneOffsetFormat([[maybe_unused]] const QLocale &locale,
                         qsizetype,
                         [[maybe_unused]] QLocale::FormatType width,
                         const QDateTime &when,
                         int offsetSeconds)
{
    // Only the non-ICU TZ-locale code uses the other two widths:
    Q_ASSERT(width == QLocale::ShortFormat); //
    QString text =
#if QT_CONFIG(timezone)
        locale != QLocale::system()
        ? when.timeRepresentation().displayName(when, QTimeZone::OffsetName, locale)
        :
#endif
        when.toOffsetFromUtc(offsetSeconds).timeZoneAbbreviation();

    if (!text.isEmpty())
        text = offsetFromAbbreviation(std::move(text));
    // else: no suitable representation of the zone.
    return text;
}